

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O2

int factorial(int32_t a)

{
  int iVar1;
  undefined8 extraout_RAX;
  int i;
  int iVar2;
  allocator<char> local_29;
  string local_28;
  
  if (-1 < a) {
    iVar1 = 1;
    if (a != 0) {
      iVar2 = 1;
      iVar1 = 1;
      while( true ) {
        if (a == iVar2) break;
        iVar1 = iVar1 * iVar2;
        iVar2 = iVar2 + 1;
      }
    }
    return iVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"factorial is not defined for negative numbers",&local_29);
  error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int factorial(int32_t a)
{
	if (a < 0)
		error("factorial is not defined for negative numbers");
	uint32_t factorial = 1;
	if (a != 0)
	{
		for (int i = 1; i < a; ++i)
			factorial *= i;
	}
	return factorial;
}